

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O2

void __thiscall
duckdb::BitwiseOperation::Combine<duckdb::BitState<duckdb::hugeint_t>,duckdb::BitXorOperation>
          (BitwiseOperation *this,BitState<duckdb::hugeint_t> *source,
          BitState<duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  uint64_t uVar1;
  hugeint_t input;
  
  if (*this == (BitwiseOperation)0x1) {
    uVar1 = *(uint64_t *)(this + 0x10);
    if (source->is_set != false) {
      input.upper = (int64_t)param_3;
      input.lower = uVar1;
      BitXorOperation::Execute<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>>
                ((BitXorOperation *)source,*(BitState<duckdb::hugeint_t> **)(this + 8),input);
      return;
    }
    (source->value).lower = (uint64_t)*(BitState<duckdb::hugeint_t> **)(this + 8);
    (source->value).upper = uVar1;
    source->is_set = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}